

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

call_modifier<trompeloeil::call_matcher<void_(),_std::tuple<>_>,_ExecutionCounter::trompeloeil_l_tag_type_trompeloeil_36,_trompeloeil::call_limit_injector<trompeloeil::matcher_info<void_()>,_1UL>_>
 __thiscall
trompeloeil::
call_modifier<trompeloeil::call_matcher<void(),std::tuple<>>,ExecutionCounter::trompeloeil_l_tag_type_trompeloeil_36,trompeloeil::matcher_info<void()>>
::times<1ul,1ul,false>
          (call_modifier<trompeloeil::call_matcher<void(),std::tuple<>>,ExecutionCounter::trompeloeil_l_tag_type_trompeloeil_36,trompeloeil::matcher_info<void()>>
           *this)

{
  pointer this_00;
  call_modifier<trompeloeil::call_matcher<void_(),_std::tuple<>_>,_ExecutionCounter::trompeloeil_l_tag_type_trompeloeil_36,_trompeloeil::matcher_info<void_()>_>
  *this_local;
  call_modifier<trompeloeil::call_matcher<void_(),_std::tuple<>_>,_ExecutionCounter::trompeloeil_l_tag_type_trompeloeil_36,_trompeloeil::call_limit_injector<trompeloeil::matcher_info<void_()>,_1UL>_>
  local_10;
  
  this_00 = Catch::clara::std::
            unique_ptr<trompeloeil::sequence_handler_base,_std::default_delete<trompeloeil::sequence_handler_base>_>
            ::operator->((unique_ptr<trompeloeil::sequence_handler_base,_std::default_delete<trompeloeil::sequence_handler_base>_>
                          *)(*(long *)this + 0x70));
  sequence_handler_base::set_limits(this_00,1,1);
  call_modifier<trompeloeil::call_matcher<void_(),_std::tuple<>_>,_ExecutionCounter::trompeloeil_l_tag_type_trompeloeil_36,_trompeloeil::call_limit_injector<trompeloeil::matcher_info<void_()>,_1UL>_>
  ::call_modifier(&local_10,*(call_matcher<void_(),_std::tuple<>_> **)this);
  return (call_modifier<trompeloeil::call_matcher<void_(),_std::tuple<>_>,_ExecutionCounter::trompeloeil_l_tag_type_trompeloeil_36,_trompeloeil::call_limit_injector<trompeloeil::matcher_info<void_()>,_1UL>_>
          )local_10.matcher;
}

Assistant:

call_modifier<Matcher, modifier_tag, call_limit_injector<Parent, H>>
    times(
      multiplicity<L, H>)
    {
      static_assert(!times_set,
                    "Only one TIMES call limit is allowed, but it can express an interval");

      static_assert(H >= L,
                    "In TIMES the first value must not exceed the second");

      static_assert(H > 0 || !throws,
                    "THROW and TIMES(0) does not make sense");

      static_assert(H > 0 || std::is_same<return_type, void>::value,
                    "RETURN and TIMES(0) does not make sense");

      static_assert(H > 0 || !side_effects,
                    "SIDE_EFFECT and TIMES(0) does not make sense");

      static_assert(H > 0 || !sequence_set,
                    "IN_SEQUENCE and TIMES(0) does not make sense");

      matcher->sequences->set_limits(L, H);
      return {matcher};
    }